

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

void * get_sfnt_table(TT_Face face,FT_Sfnt_Tag tag)

{
  TT_OS2 *local_40;
  TT_OS2 *local_38;
  TT_OS2 *local_30;
  TT_OS2 *local_20;
  void *table;
  FT_Sfnt_Tag tag_local;
  TT_Face face_local;
  
  switch(tag) {
  case FT_SFNT_HEAD:
    local_20 = (TT_OS2 *)&face->header;
    break;
  case FT_SFNT_MAXP:
    local_20 = (TT_OS2 *)&face->max_profile;
    break;
  case FT_SFNT_OS2:
    if ((face->os2).version == 0xffff) {
      local_38 = (TT_OS2 *)0x0;
    }
    else {
      local_38 = &face->os2;
    }
    local_20 = local_38;
    break;
  case FT_SFNT_HHEA:
    local_20 = (TT_OS2 *)&face->horizontal;
    break;
  case FT_SFNT_VHEA:
    if (face->vertical_info == '\0') {
      local_30 = (TT_OS2 *)0x0;
    }
    else {
      local_30 = (TT_OS2 *)&face->vertical;
    }
    local_20 = local_30;
    break;
  case FT_SFNT_POST:
    local_20 = (TT_OS2 *)&face->postscript;
    break;
  case FT_SFNT_PCLT:
    if ((face->pclt).Version == 0) {
      local_40 = (TT_OS2 *)0x0;
    }
    else {
      local_40 = (TT_OS2 *)&face->pclt;
    }
    local_20 = local_40;
    break;
  default:
    local_20 = (TT_OS2 *)0x0;
  }
  return local_20;
}

Assistant:

static void*
  get_sfnt_table( TT_Face      face,
                  FT_Sfnt_Tag  tag )
  {
    void*  table;


    switch ( tag )
    {
    case FT_SFNT_HEAD:
      table = &face->header;
      break;

    case FT_SFNT_HHEA:
      table = &face->horizontal;
      break;

    case FT_SFNT_VHEA:
      table = face->vertical_info ? &face->vertical : NULL;
      break;

    case FT_SFNT_OS2:
      table = ( face->os2.version == 0xFFFFU ) ? NULL : &face->os2;
      break;

    case FT_SFNT_POST:
      table = &face->postscript;
      break;

    case FT_SFNT_MAXP:
      table = &face->max_profile;
      break;

    case FT_SFNT_PCLT:
      table = face->pclt.Version ? &face->pclt : NULL;
      break;

    default:
      table = NULL;
    }

    return table;
  }